

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seed_rng.hpp
# Opt level: O0

void __thiscall boost::uuids::detail::seed_rng::seed_rng(seed_rng *this)

{
  FILE *pFVar1;
  void *in_RDI;
  
  *(undefined4 *)((long)in_RDI + 0x14) = 5;
  *(undefined8 *)((long)in_RDI + 0x18) = 0;
  pFVar1 = fopen("/dev/urandom","rb");
  *(FILE **)((long)in_RDI + 0x18) = pFVar1;
  memset(in_RDI,0,0x14);
  return;
}

Assistant:

seed_rng() BOOST_NOEXCEPT
        : rd_index_(5)
        , random_(0)
    {
#if defined(BOOST_WINDOWS)
        if (!boost::winapi::CryptAcquireContextW(
                    &random_,
                    NULL,
                    NULL,
                    boost::winapi::PROV_RSA_FULL_,
                    boost::winapi::CRYPT_VERIFYCONTEXT_ | boost::winapi::CRYPT_SILENT_))
        {
            random_ = 0;
        }
#else
        random_ = std::fopen( "/dev/urandom", "rb" );
#endif

        std::memset(rd_, 0, sizeof(rd_));
    }